

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void sqlite3DeleteIndexSamples(sqlite3 *db,Index *pIdx)

{
  void *p;
  int iVar1;
  IndexSample *p_00;
  long lVar2;
  long lVar3;
  
  p_00 = pIdx->aSample;
  if (p_00 != (IndexSample *)0x0) {
    iVar1 = pIdx->nSample;
    if (0 < iVar1) {
      lVar3 = 0;
      lVar2 = 0;
      do {
        p = *(void **)((long)&pIdx->aSample->p + lVar3);
        if (p != (void *)0x0) {
          sqlite3DbFreeNN(db,p);
          iVar1 = pIdx->nSample;
        }
        lVar2 = lVar2 + 1;
        lVar3 = lVar3 + 0x28;
      } while (lVar2 < iVar1);
      p_00 = pIdx->aSample;
      if (p_00 == (IndexSample *)0x0) goto LAB_00153ab1;
    }
    sqlite3DbFreeNN(db,p_00);
  }
LAB_00153ab1:
  if ((db != (sqlite3 *)0x0) && (db->pnBytesFreed == (int *)0x0)) {
    pIdx->nSample = 0;
    pIdx->aSample = (IndexSample *)0x0;
  }
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3DeleteIndexSamples(sqlite3 *db, Index *pIdx){
#ifdef SQLITE_ENABLE_STAT3_OR_STAT4
  if( pIdx->aSample ){
    int j;
    for(j=0; j<pIdx->nSample; j++){
      IndexSample *p = &pIdx->aSample[j];
      sqlite3DbFree(db, p->p);
    }
    sqlite3DbFree(db, pIdx->aSample);
  }
  if( db && db->pnBytesFreed==0 ){
    pIdx->nSample = 0;
    pIdx->aSample = 0;
  }
#else
  UNUSED_PARAMETER(db);
  UNUSED_PARAMETER(pIdx);
#endif /* SQLITE_ENABLE_STAT3_OR_STAT4 */
}